

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::EM(IMLE *this,Z *z,X *x)

{
  Z *this_00;
  X *this_01;
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  double *pdVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  pointer pFVar11;
  pointer pFVar12;
  double *pdVar13;
  ulong uVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  iterator it;
  ActualDstType actualDst;
  undefined4 uVar18;
  undefined4 uVar19;
  double dVar20;
  Scalar SVar21;
  undefined1 in_XMM2 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  X sum_diagPsi;
  ThisEvaluator thisEval;
  Z sum_diagSigma;
  scalar_product_op<double,_double> local_379;
  undefined1 local_378 [16];
  double local_368;
  undefined8 uStack_360;
  DenseStorage<double,__1,__1,_1,_0> local_358;
  double local_348;
  plainobjectbase_evaluator_data<double,_0> local_340;
  double local_338;
  FastLinearExpert local_330;
  
  dVar20 = 0.0;
  pFVar11 = (this->experts).
            super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>.
            super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
            ._M_impl.super__Vector_impl_data._M_start;
  for (pFVar12 = pFVar11;
      pFVar12 < (this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_finish; pFVar12 = pFVar12 + 1) {
    dVar20 = dVar20 + (pFVar12->super_LinearExpert).h;
  }
  if ((dVar20 != 0.0) || (NAN(dVar20))) {
    pFVar12 = (this->experts).
              super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              .
              super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    local_378._0_8_ = dVar20;
    if ((this->param).accelerated == false) {
      if (pFVar11 < pFVar12) {
        do {
          FastLinearExpert::e_step(pFVar11,z,x,(pFVar11->super_LinearExpert).h / dVar20);
          FastLinearExpert::m_step(pFVar11);
          pFVar11 = pFVar11 + 1;
          dVar20 = (double)local_378._0_8_;
        } while (pFVar11 < (this->experts).
                           super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           .
                           super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
    else if (pFVar11 < pFVar12) {
      do {
        dVar6 = (pFVar11->super_LinearExpert).h / dVar20;
        if (0.001 < dVar6) {
          FastLinearExpert::e_step(pFVar11,z,x,dVar6);
          FastLinearExpert::m_step(pFVar11);
          dVar20 = (double)local_378._0_8_;
        }
        in_XMM2 = ZEXT816(0x3f50624dd2f1a9fc);
        pFVar11 = pFVar11 + 1;
      } while (pFVar11 < (this->experts).
                         super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         .
                         super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  else {
    FastLinearExpert::FastLinearExpert(&local_330,this->d,this->D,z,x,this);
    std::vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>::
    push_back(&(this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
              ,&local_330);
    free(local_330.invSzz0.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_data);
    free(local_330.invSzz.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
         .m_data);
    LinearExpert::~LinearExpert(&local_330.super_LinearExpert);
    FastLinearExpert::e_step
              ((this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1,z,x,1.0);
    FastLinearExpert::m_step
              ((this->experts).
               super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               .
               super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    this->M = (int)((ulong)((long)(this->experts).
                                  super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                  .
                                  super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(this->experts).
                                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                 .
                                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3) * 0x5f02a3a1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"e_step: sum_h = 0.0! (Should not happen)",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
    std::ostream::put('(');
    std::ostream::flush();
  }
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            ((DenseStorage<double,__1,__1,_1,_0> *)&local_330,
             (DenseStorage<double,__1,__1,_1,_0> *)&this->zeroZ);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_358,(DenseStorage<double,__1,__1,_1,_0> *)&this->zeroX);
  uVar9 = local_330.super_LinearExpert._0_8_;
  for (pFVar11 = (this->experts).
                 super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 .
                 super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      pFVar11 < (this->experts).
                super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                .
                super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                ._M_impl.super__Vector_impl_data._M_finish; pFVar11 = pFVar11 + 1) {
    if (0 < (long)local_330.super_LinearExpert.Nu.
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
      pdVar13 = (pFVar11->super_LinearExpert).invSigma.
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data;
      lVar17 = (pFVar11->super_LinearExpert).invSigma.
               super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows;
      pdVar16 = (double *)0x0;
      do {
        *(double *)(local_330.super_LinearExpert._0_8_ + pdVar16 * 8) =
             *pdVar13 + *(double *)(local_330.super_LinearExpert._0_8_ + pdVar16 * 8);
        pdVar16 = (double *)((long)pdVar16 + 1);
        pdVar13 = pdVar13 + lVar17 + 1;
      } while (local_330.super_LinearExpert.Nu.
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data !=
               pdVar16);
    }
    pdVar13 = (pFVar11->super_LinearExpert).invPsi.
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
    uVar15 = local_358.m_rows - (local_358.m_rows >> 0x3f) & 0xfffffffffffffffe;
    if (1 < local_358.m_rows) {
      lVar17 = 0;
      do {
        pdVar16 = pdVar13 + lVar17;
        dVar20 = pdVar16[1] + (local_358.m_data + lVar17)[1];
        auVar22._8_4_ = SUB84(dVar20,0);
        auVar22._0_8_ = *pdVar16 + local_358.m_data[lVar17];
        auVar22._12_4_ = (int)((ulong)dVar20 >> 0x20);
        *(undefined1 (*) [16])(local_358.m_data + lVar17) = auVar22;
        lVar17 = lVar17 + 2;
      } while (lVar17 < (long)uVar15);
    }
    if ((long)uVar15 < local_358.m_rows) {
      do {
        local_358.m_data[uVar15] = pdVar13[uVar15] + local_358.m_data[uVar15];
        uVar15 = uVar15 + 1;
      } while (local_358.m_rows != uVar15);
    }
  }
  local_378._8_8_ = 0;
  local_378._0_8_ = (double)this->M;
  local_348 = (this->param).wsigma;
  local_338 = (this->param).wSigma;
  local_368 = local_338 * local_348 * (this->param).sigma0;
  uStack_360 = 0;
  this_00 = &this->Sigma;
  if ((double *)
      (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_330.super_LinearExpert.Nu.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_330.super_LinearExpert.Nu.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data,1);
  }
  uVar10 = local_330.super_LinearExpert._0_8_;
  uVar18 = local_378._8_4_;
  uVar19 = local_378._12_4_;
  pdVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      pdVar16 = (double *)(uVar9 + lVar17 * 8);
      dVar20 = pdVar16[1];
      pdVar5 = pdVar13 + lVar17;
      *pdVar5 = *pdVar16 * local_368;
      pdVar5[1] = dVar20 * local_368;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  local_378._0_8_ = (local_378._0_8_ * local_338 - local_348) * 0.5 + -1.0;
  local_378._8_4_ = uVar18;
  local_378._12_4_ = uVar19;
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar13[uVar14] = *(double *)(uVar9 + uVar14 * 8) * local_368;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  dVar20 = (double)local_378._0_8_ * (double)local_378._0_8_;
  pdVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      in_XMM2._0_8_ = pdVar13[lVar17] + dVar20;
      in_XMM2._8_8_ = (pdVar13 + lVar17)[1] + dVar20;
      *(undefined1 (*) [16])(pdVar13 + lVar17) = in_XMM2;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar13[uVar14] = pdVar13[uVar14] + dVar20;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  local_368 = (this->param).wSigma;
  uStack_360 = 0;
  pdVar13 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  if ((double *)
      (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != local_330.super_LinearExpert.Nu.
         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               (Index)local_330.super_LinearExpert.Nu.
                      super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                      m_data,1);
  }
  pdVar5 = local_358.m_data;
  pdVar16 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      auVar22 = sqrtpd(in_XMM2,*(undefined1 (*) [16])(pdVar13 + lVar17));
      auVar23._0_8_ = auVar22._0_8_ + (double)local_378._0_8_;
      auVar23._8_8_ = auVar22._8_8_ + (double)local_378._0_8_;
      pdVar1 = (double *)(uVar10 + lVar17 * 8);
      auVar7._8_8_ = pdVar1[1] * local_368;
      auVar7._0_8_ = *pdVar1 * local_368;
      in_XMM2 = divpd(auVar23,auVar7);
      *(undefined1 (*) [16])(pdVar16 + lVar17) = in_XMM2;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar16[uVar14] =
           (SQRT(pdVar13[uVar14]) + (double)local_378._0_8_) /
           (*(double *)(uVar10 + uVar14 * 8) * local_368);
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  local_378._8_8_ = 0;
  local_378._0_8_ = (double)this->M;
  local_368 = (this->param).wPsi;
  uStack_360 = 0;
  local_348 = (this->param).wpsi;
  this_01 = &this->Psi;
  pdVar13 = (this->param).Psi0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_data;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_358.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_358.m_rows,1);
  }
  pdVar1 = local_358.m_data;
  uVar18 = local_378._12_4_;
  auVar25._0_8_ = local_368 * local_348;
  auVar25._8_8_ = (double)uStack_360;
  pdVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      pdVar2 = pdVar13 + lVar17;
      dVar20 = pdVar2[1];
      pdVar4 = pdVar5 + lVar17;
      dVar6 = pdVar4[1];
      pdVar3 = pdVar16 + lVar17;
      *pdVar3 = *pdVar2 * auVar25._0_8_ * *pdVar4;
      pdVar3[1] = dVar20 * auVar25._0_8_ * dVar6;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  dVar20 = (local_378._0_8_ * local_368 - local_348) * 0.5 + -1.0;
  local_378._8_4_ = local_378._8_4_;
  local_378._0_8_ = dVar20;
  local_378._12_4_ = uVar18;
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar16[uVar14] = pdVar13[uVar14] * auVar25._0_8_ * pdVar5[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  dVar20 = dVar20 * dVar20;
  pdVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      auVar25._0_8_ = pdVar13[lVar17] + dVar20;
      auVar25._8_8_ = (pdVar13 + lVar17)[1] + dVar20;
      *(undefined1 (*) [16])(pdVar13 + lVar17) = auVar25;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar13[uVar14] = pdVar13[uVar14] + dVar20;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  local_368 = (this->param).wPsi;
  uStack_360 = 0;
  pdVar13 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      local_358.m_rows) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              (&this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
               local_358.m_rows,1);
  }
  pdVar16 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_data;
  uVar15 = (this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows;
  uVar14 = uVar15 - ((long)uVar15 >> 0x3f) & 0xfffffffffffffffe;
  if (1 < (long)uVar15) {
    lVar17 = 0;
    do {
      auVar22 = sqrtpd(auVar25,*(undefined1 (*) [16])(pdVar13 + lVar17));
      auVar24._0_8_ = auVar22._0_8_ + (double)local_378._0_8_;
      auVar24._8_8_ = auVar22._8_8_ + (double)local_378._0_8_;
      pdVar5 = pdVar1 + lVar17;
      auVar8._8_8_ = pdVar5[1] * local_368;
      auVar8._0_8_ = *pdVar5 * local_368;
      auVar25 = divpd(auVar24,auVar8);
      *(undefined1 (*) [16])(pdVar16 + lVar17) = auVar25;
      lVar17 = lVar17 + 2;
    } while (lVar17 < (long)uVar14);
  }
  if ((long)uVar14 < (long)uVar15) {
    do {
      pdVar16[uVar14] =
           (SQRT(pdVar13[uVar14]) + (double)local_378._0_8_) / (pdVar1[uVar14] * local_368);
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  local_378._0_8_ = this->sig_level_noiseX_rbf;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows ==
      0) {
    uVar18 = 0;
    uVar19 = 0x3ff00000;
  }
  else {
    local_340.data =
         (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar21 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_01);
    uVar18 = SUB84(SVar21,0);
    uVar19 = (undefined4)((ulong)SVar21 >> 0x20);
  }
  if ((double)CONCAT44(uVar19,uVar18) < 0.0) {
    dVar20 = sqrt((double)CONCAT44(uVar19,uVar18));
  }
  else {
    dVar20 = SQRT((double)CONCAT44(uVar19,uVar18));
  }
  this->pNoiseModelX = (double)local_378._0_8_ / dVar20;
  local_378._0_8_ = this->sig_level_noiseZ_rbf;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      == 0) {
    uVar18 = 0;
    uVar19 = 0x3ff00000;
  }
  else {
    local_340.data =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar21 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_00);
    uVar18 = SUB84(SVar21,0);
    uVar19 = (undefined4)((ulong)SVar21 >> 0x20);
  }
  if ((double)CONCAT44(uVar19,uVar18) < 0.0) {
    dVar20 = sqrt((double)CONCAT44(uVar19,uVar18));
  }
  else {
    dVar20 = SQRT((double)CONCAT44(uVar19,uVar18));
  }
  this->pNoiseModelZ = (double)local_378._0_8_ / dVar20;
  local_378._0_8_ = this->sig_level_noiseZX_rbf;
  SVar21 = 1.0;
  if ((this->Psi).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows !=
      0) {
    local_340.data =
         (this_01->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    SVar21 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_01);
  }
  uVar19 = 0x3ff00000;
  uVar18 = 0;
  if ((this->Sigma).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
      != 0) {
    local_340.data =
         (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data;
    local_368 = SVar21;
    SVar21 = Eigen::internal::
             redux_impl<Eigen::internal::scalar_product_op<double,double>,Eigen::internal::redux_evaluator<Eigen::Matrix<double,-1,1,0,-1,1>>,3,0>
             ::run<Eigen::Matrix<double,_1,1,0,_1,1>>
                       ((redux_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_340,
                        &local_379,this_00);
    uVar18 = SUB84(SVar21,0);
    uVar19 = (undefined4)((ulong)SVar21 >> 0x20);
    SVar21 = local_368;
  }
  dVar20 = SVar21 * (double)CONCAT44(uVar19,uVar18);
  if (dVar20 < 0.0) {
    dVar20 = sqrt(dVar20);
  }
  else {
    dVar20 = SQRT(dVar20);
  }
  this->pNoiseModelZX = (double)local_378._0_8_ / dVar20;
  free(local_358.m_data);
  free((void *)local_330.super_LinearExpert._0_8_);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::EM(Z const &z, X const &x)
{
    // Expectation Step
    Scal h, sum_h = 0.0;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        sum_h += it->get_h();

    if( sum_h == 0.0)
    {
        // Create new linear expert
#ifdef IMLE_NO_TEMPLATES
        experts.push_back( Expert(d,D,z,x,this) );
#else
        experts.push_back( Expert(z,x,this) );
#endif
        experts.back().e_step(z,x,1.0);
        experts.back().m_step();
        M = experts.size();
        std::cout << "e_step: sum_h = 0.0! (Should not happen)" << std::endl;
    }
    else if( param.accelerated )
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            if( (h = it->get_h()/sum_h) > 0.001 )
            {
                it->e_step( z, x, h );
                it->m_step();
            }

        }
    else
        for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
        {
            it->e_step( z, x, it->get_h()/sum_h );
            it->m_step();
        }

    // Maximization Step
    //
    Z sum_diagSigma = zeroZ;
    X sum_diagPsi = zeroX;
    for(IMLE_TYPENAME Experts::iterator it=experts.begin(); it < experts.end(); it++)
    {
        sum_diagSigma += it->invSigma.diagonal();
        sum_diagPsi += it->invPsi;
    }

    // Update common inverse-Wishart prior on Sigma
    Scal tmp = (M*param.wSigma - param.wsigma)/2.0 - 1.0;
    Sigma = param.wSigma * param.wsigma * param.sigma0 * sum_diagSigma;
    Sigma.array() += tmp*tmp;
    Sigma.array() = (Sigma.array().sqrt() + tmp) / (param.wSigma * sum_diagSigma.array());

    // Update common inverse-gamma prior on Psi
    tmp = (M*param.wPsi - param.wpsi)/2.0 - 1.0;
    Psi.array() = (param.wPsi * param.wpsi) * param.Psi0.array() * sum_diagPsi.array();
    Psi.array() += tmp*tmp;
    Psi.array() = (Psi.array().sqrt() + tmp) / (param.wPsi * sum_diagPsi.array());

    // Update outlier model
    pNoiseModelX = sig_level_noiseX_rbf / sqrt(Psi.prod());
    pNoiseModelZ = sig_level_noiseZ_rbf / sqrt(Sigma.prod());
    pNoiseModelZX = sig_level_noiseZX_rbf / sqrt(Psi.prod() * Sigma.prod());
}